

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int cbs_get_asn1(CBS *cbs,CBS *out,CBS_ASN1_TAG tag_value,int skip_header)

{
  int iVar1;
  undefined1 local_48 [8];
  CBS throwaway;
  size_t sStack_30;
  CBS_ASN1_TAG tag;
  size_t header_len;
  int skip_header_local;
  CBS_ASN1_TAG tag_value_local;
  CBS *out_local;
  CBS *cbs_local;
  
  _skip_header_local = out;
  if (out == (CBS *)0x0) {
    _skip_header_local = (CBS *)local_48;
  }
  header_len._0_4_ = skip_header;
  header_len._4_4_ = tag_value;
  out_local = cbs;
  iVar1 = CBS_get_any_asn1_element
                    (cbs,_skip_header_local,(CBS_ASN1_TAG *)((long)&throwaway.len + 4),
                     &stack0xffffffffffffffd0);
  if ((iVar1 == 0) || (throwaway.len._4_4_ != header_len._4_4_)) {
    cbs_local._4_4_ = 0;
  }
  else {
    if ((int)header_len != 0) {
      iVar1 = CBS_skip(_skip_header_local,sStack_30);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                      ,0x1c5,"int cbs_get_asn1(CBS *, CBS *, CBS_ASN1_TAG, int)");
      }
    }
    cbs_local._4_4_ = 1;
  }
  return cbs_local._4_4_;
}

Assistant:

static int cbs_get_asn1(CBS *cbs, CBS *out, CBS_ASN1_TAG tag_value,
                        int skip_header) {
  size_t header_len;
  CBS_ASN1_TAG tag;
  CBS throwaway;

  if (out == NULL) {
    out = &throwaway;
  }

  if (!CBS_get_any_asn1_element(cbs, out, &tag, &header_len) ||
      tag != tag_value) {
    return 0;
  }

  if (skip_header && !CBS_skip(out, header_len)) {
    assert(0);
    return 0;
  }

  return 1;
}